

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_readwrite(connectdata *conn,Curl_easy *data,_Bool *done,_Bool *comeback)

{
  SingleRequest *pSVar1;
  _Bool *data_00;
  CURLcode CVar2;
  int iVar3;
  time_t tVar4;
  timeval tVar5;
  time_t ms;
  __suseconds_t local_58;
  uint local_4c;
  curl_socket_t local_48;
  int select_res;
  curl_socket_t fd_write;
  curl_socket_t fd_read;
  int didwhat;
  CURLcode result;
  SingleRequest *k;
  _Bool *comeback_local;
  _Bool *done_local;
  Curl_easy *data_local;
  connectdata *conn_local;
  
  _didwhat = &data->req;
  fd_write = 0;
  local_4c = conn->cselect_bits;
  conn->cselect_bits = 0;
  if (((data->req).keepon & 0x15U) == 1) {
    select_res = conn->sockfd;
  }
  else {
    select_res = -1;
  }
  if (((data->req).keepon & 0x2aU) == 2) {
    local_48 = conn->writesockfd;
  }
  else {
    local_48 = -1;
  }
  if ((conn->data->state).drain != 0) {
    local_4c = local_4c | 1;
  }
  k = (SingleRequest *)comeback;
  comeback_local = done;
  done_local = (_Bool *)data;
  data_local = (Curl_easy *)conn;
  if (local_4c == 0) {
    local_4c = Curl_socket_check(select_res,-1,local_48,0);
  }
  if (local_4c == 4) {
    Curl_failf((Curl_easy *)done_local,"select/poll returned error");
    conn_local._4_4_ = CURLE_SEND_ERROR;
  }
  else {
    if (((_didwhat->keepon & 1U) != 0) &&
       (((local_4c & 1) != 0 || (((data_local->set).set_resume_from & 0x100) != 0)))) {
      CVar2 = readwrite_data((Curl_easy *)done_local,(connectdata *)data_local,_didwhat,&fd_write,
                             comeback_local,(_Bool *)k);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      if ((*comeback_local & 1U) != 0) {
        return CURLE_OK;
      }
      fd_read = 0;
    }
    if (((_didwhat->keepon & 2U) != 0) && ((local_4c & 2) != 0)) {
      CVar2 = readwrite_upload((Curl_easy *)done_local,(connectdata *)data_local,_didwhat,&fd_write)
      ;
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      fd_read = 0;
    }
    pSVar1 = _didwhat;
    tVar5 = curlx_tvnow();
    ms = tVar5.tv_sec;
    (pSVar1->now).tv_sec = ms;
    local_58 = tVar5.tv_usec;
    (pSVar1->now).tv_usec = local_58;
    if (fd_write == 0) {
      if ((_didwhat->exp100 == EXP100_AWAITING_CONTINUE) &&
         (tVar4 = curlx_tvdiff(_didwhat->now,_didwhat->start100),
         *(long *)(done_local + 0x898) <= tVar4)) {
        _didwhat->exp100 = EXP100_SEND_DATA;
        _didwhat->keepon = _didwhat->keepon | 2;
        Curl_infof((Curl_easy *)done_local,"Done waiting for 100-continue\n");
      }
    }
    else {
      if (_didwhat->bytecountp != (curl_off_t *)0x0) {
        *_didwhat->bytecountp = _didwhat->bytecount;
      }
      if (_didwhat->writebytecountp != (curl_off_t *)0x0) {
        *_didwhat->writebytecountp = _didwhat->writebytecount;
      }
    }
    iVar3 = Curl_pgrsUpdate((connectdata *)data_local);
    if (iVar3 == 0) {
      fd_read = Curl_speedcheck((Curl_easy *)done_local,_didwhat->now);
    }
    else {
      fd_read = 0x2a;
    }
    if (fd_read == 0) {
      if (_didwhat->keepon == 0) {
        if (((((done_local[0x5f0] & 1U) == 0) && (_didwhat->size != -1)) &&
            (_didwhat->bytecount != _didwhat->size)) &&
           ((_didwhat->bytecount != _didwhat->size + *(long *)(done_local + 0x4c70) &&
            (*(long *)(done_local + 0x1f8) == 0)))) {
          Curl_failf((Curl_easy *)done_local,"transfer closed with %lld bytes remaining to read",
                     _didwhat->size - _didwhat->bytecount);
          return CURLE_PARTIAL_FILE;
        }
        if ((((done_local[0x5f0] & 1U) == 0) && ((_didwhat->chunk & 1U) != 0)) &&
           ((data_local->msg).extmsg.msg != 4)) {
          Curl_failf((Curl_easy *)done_local,"transfer closed with outstanding read data remaining")
          ;
          return CURLE_PARTIAL_FILE;
        }
        iVar3 = Curl_pgrsUpdate((connectdata *)data_local);
        if (iVar3 != 0) {
          return CURLE_ABORTED_BY_CALLBACK;
        }
      }
      else {
        tVar4 = Curl_timeleft((Curl_easy *)done_local,&_didwhat->now,false);
        data_00 = done_local;
        if (tVar4 < 0) {
          if (_didwhat->size == -1) {
            tVar4 = curlx_tvdiff(_didwhat->now,*(timeval *)(done_local + 0x990));
            Curl_failf((Curl_easy *)data_00,
                       "Operation timed out after %ld milliseconds with %lld bytes received",tVar4,
                       _didwhat->bytecount);
          }
          else {
            tVar4 = curlx_tvdiff(_didwhat->now,*(timeval *)(done_local + 0x990));
            Curl_failf((Curl_easy *)data_00,
                       "Operation timed out after %ld milliseconds with %lld out of %lld bytes received"
                       ,tVar4,_didwhat->bytecount,_didwhat->size);
          }
          return CURLE_OPERATION_TIMEDOUT;
        }
      }
      *comeback_local = (_didwhat->keepon & 0x33U) == 0;
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      conn_local._4_4_ = fd_read;
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_readwrite(struct connectdata *conn,
                        struct Curl_easy *data,
                        bool *done,
                        bool *comeback)
{
  struct SingleRequest *k = &data->req;
  CURLcode result;
  int didwhat=0;

  curl_socket_t fd_read;
  curl_socket_t fd_write;
  int select_res = conn->cselect_bits;

  conn->cselect_bits = 0;

  /* only use the proper socket if the *_HOLD bit is not set simultaneously as
     then we are in rate limiting state in that transfer direction */

  if((k->keepon & KEEP_RECVBITS) == KEEP_RECV)
    fd_read = conn->sockfd;
  else
    fd_read = CURL_SOCKET_BAD;

  if((k->keepon & KEEP_SENDBITS) == KEEP_SEND)
    fd_write = conn->writesockfd;
  else
    fd_write = CURL_SOCKET_BAD;

  if(conn->data->state.drain) {
    select_res |= CURL_CSELECT_IN;
    DEBUGF(infof(data, "Curl_readwrite: forcibly told to drain data\n"));
  }

  if(!select_res) /* Call for select()/poll() only, if read/write/error
                     status is not known. */
    select_res = Curl_socket_check(fd_read, CURL_SOCKET_BAD, fd_write, 0);

  if(select_res == CURL_CSELECT_ERR) {
    failf(data, "select/poll returned error");
    return CURLE_SEND_ERROR;
  }

  /* We go ahead and do a read if we have a readable socket or if
     the stream was rewound (in which case we have data in a
     buffer) */
  if((k->keepon & KEEP_RECV) &&
     ((select_res & CURL_CSELECT_IN) || conn->bits.stream_was_rewound)) {

    result = readwrite_data(data, conn, k, &didwhat, done, comeback);
    if(result || *done)
      return result;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if((k->keepon & KEEP_SEND) && (select_res & CURL_CSELECT_OUT)) {
    /* write */

    result = readwrite_upload(data, conn, k, &didwhat);
    if(result)
      return result;
  }

  k->now = Curl_tvnow();
  if(didwhat) {
    /* Update read/write counters */
    if(k->bytecountp)
      *k->bytecountp = k->bytecount; /* read count */
    if(k->writebytecountp)
      *k->writebytecountp = k->writebytecount; /* write count */
  }
  else {
    /* no read no write, this is a timeout? */
    if(k->exp100 == EXP100_AWAITING_CONTINUE) {
      /* This should allow some time for the header to arrive, but only a
         very short time as otherwise it'll be too much wasted time too
         often. */

      /* Quoting RFC2616, section "8.2.3 Use of the 100 (Continue) Status":

         Therefore, when a client sends this header field to an origin server
         (possibly via a proxy) from which it has never seen a 100 (Continue)
         status, the client SHOULD NOT wait for an indefinite period before
         sending the request body.

      */

      time_t ms = Curl_tvdiff(k->now, k->start100);
      if(ms >= data->set.expect_100_timeout) {
        /* we've waited long enough, continue anyway */
        k->exp100 = EXP100_SEND_DATA;
        k->keepon |= KEEP_SEND;
        infof(data, "Done waiting for 100-continue\n");
      }
    }
  }

  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, k->now);
  if(result)
    return result;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, &k->now, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " out of %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount,
              k->size);
      }
      else {
        failf(data, "Operation timed out after %ld milliseconds with %"
              CURL_FORMAT_CURL_OFF_T " bytes received",
              Curl_tvdiff(k->now, data->progress.t_startsingle), k->bytecount);
      }
      return CURLE_OPERATION_TIMEDOUT;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */

    if(!(data->set.opt_no_body) && (k->size != -1) &&
       (k->bytecount != k->size) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs,
          so we'll check to see if the discrepancy can be explained
          by the number of CRLFs we've changed to LFs.
       */
       (k->bytecount != (k->size + data->state.crlf_conversions)) &&
#endif /* CURL_DO_LINEEND_CONV */
       !data->req.newurl) {
      failf(data, "transfer closed with %" CURL_FORMAT_CURL_OFF_T
            " bytes remaining to read",
            k->size - k->bytecount);
      return CURLE_PARTIAL_FILE;
    }
    else if(!(data->set.opt_no_body) &&
            k->chunk &&
            (conn->chunk.state != CHUNK_STOP)) {
      /*
       * In chunked mode, return an error if the connection is closed prior to
       * the empty (terminating) chunk is read.
       *
       * The condition above used to check for
       * conn->proto.http->chunk.datasize != 0 which is true after reading
       * *any* chunk, not just the empty chunk.
       *
       */
      failf(data, "transfer closed with outstanding read data remaining");
      return CURLE_PARTIAL_FILE;
    }
    if(Curl_pgrsUpdate(conn))
      return CURLE_ABORTED_BY_CALLBACK;
  }

  /* Now update the "done" boolean we return */
  *done = (0 == (k->keepon&(KEEP_RECV|KEEP_SEND|
                            KEEP_RECV_PAUSE|KEEP_SEND_PAUSE))) ? TRUE : FALSE;

  return CURLE_OK;
}